

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double *pdVar1;
  point_type *ppVar2;
  bool bVar3;
  size_t __i;
  long lVar4;
  result_type rVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  boundary_t *extraout_RDX;
  boundary_t *extraout_RDX_00;
  boundary_t *extraout_RDX_01;
  boundary_t *extraout_RDX_02;
  boundary_t *extraout_RDX_03;
  boundary_t *extraout_RDX_04;
  boundary_t *extraout_RDX_05;
  boundary_t *extraout_RDX_06;
  boundary_t *extraout_RDX_07;
  boundary_t *extraout_RDX_08;
  boundary_t *extraout_RDX_09;
  boundary_t *extraout_RDX_10;
  boundary_t *pbVar13;
  unsigned_long uVar14;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *__range1;
  char cVar15;
  char cVar16;
  double dVar17;
  __normal_iterator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_*,_std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  __i_1;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  vals;
  aabb_t q;
  string __str;
  string __str_1;
  string fname;
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  boxes;
  uniform_int_distribution<unsigned_long> uni;
  rtree_t tree;
  boundary_t bdry;
  mt19937 mt_;
  double *local_1638;
  double *pdStack_1630;
  double local_1628;
  undefined4 uStack_1620;
  undefined4 uStack_161c;
  rectangle<perior::point<double,_2UL>_> local_1618;
  double *local_15f8;
  uint local_15f0;
  undefined4 uStack_15ec;
  double local_15e8 [2];
  double *local_15d8;
  uint local_15d0;
  undefined4 uStack_15cc;
  double local_15c8 [2];
  value_type local_15b8;
  double *local_1588;
  long local_1580;
  double local_1578 [2];
  void *local_1568;
  iterator iStack_1560;
  rectangle<perior::point<double,_2UL>_> *local_1558;
  uniform_int_distribution<unsigned_long> local_1548;
  undefined1 local_1538 [16];
  double local_1528;
  double dStack_1520;
  double local_1518;
  double dStack_1510;
  double local_1508;
  double dStack_1500;
  double local_14f8;
  double dStack_14f0;
  pointer local_14e8;
  stored_size_type sStack_14e0;
  stored_size_type local_14d8;
  pointer ppStack_14d0;
  stored_size_type local_14c8;
  stored_size_type sStack_14c0;
  unsigned_long *local_14b8;
  stored_size_type local_14b0;
  stored_size_type local_14a8;
  unsigned_long local_14a0 [8];
  unsigned_long *local_1460;
  stored_size_type local_1458;
  stored_size_type local_1450;
  unsigned_long local_1448 [10];
  cubic_periodic_boundary<perior::point<double,_2UL>_> local_13f8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = 0;
  local_13b8._M_x[1] = 0;
  local_1538._0_8_ = 1000.0;
  local_1538._8_8_ = 1000.0;
  perior::cubic_periodic_boundary<perior::point<double,_2UL>_>::cubic_periodic_boundary
            (&local_13f8,(point_type *)&local_13b8,(point_type *)local_1538);
  local_1538._0_8_ = -NAN;
  local_1528 = local_13f8.lower_.values_.elems[0];
  dStack_1520 = local_13f8.lower_.values_.elems[1];
  local_1518 = local_13f8.upper_.values_.elems[0];
  dStack_1510 = local_13f8.upper_.values_.elems[1];
  local_1508 = local_13f8.width_.values_.elems[0];
  dStack_1500 = local_13f8.width_.values_.elems[1];
  local_14f8 = local_13f8.half_width_.values_.elems[0];
  dStack_14f0 = local_13f8.half_width_.values_.elems[1];
  local_14b8 = local_14a0;
  local_14e8 = (pointer)0x0;
  sStack_14e0 = 0;
  local_14d8 = 0;
  ppStack_14d0 = (pointer)0x0;
  local_14c8 = 0;
  sStack_14c0 = 0;
  local_14b0 = 0;
  local_14a8 = 8;
  local_1460 = local_1448;
  local_1458 = 0;
  local_1450 = 8;
  local_13b8._M_x[0] = 0x75bcd15;
  lVar4 = 1;
  uVar10 = 0x75bcd15;
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar4);
    local_13b8._M_x[lVar4] = uVar10;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b8._M_p = 0x270;
  uVar10 = 0;
  local_1548._M_param._M_a = 0;
  local_1548._M_param._M_b = 10000;
  local_1558 = (rectangle<perior::point<double,_2UL>_> *)0x0;
  local_1568 = (void *)0x0;
  iStack_1560._M_current = (rectangle<perior::point<double,_2UL>_> *)0x0;
  ppVar2 = &local_15b8.first.radius;
  do {
    local_1618.radius.values_.elems[0] = 0.0;
    local_1618.radius.values_.elems[1] = 0.0;
    local_1618.center.values_.elems[0] = 0.0;
    local_1618.center.values_.elems[1] = 0.0;
    rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_1548,&local_13b8,&local_1548._M_param);
    iVar9 = (int)rVar5 + (int)(rVar5 / 100) * -100;
    dVar17 = (double)(iVar9 * 10);
    dVar21 = (double)((rVar5 / 100) * 10);
    dVar22 = (double)(iVar9 * 10 + 10);
    local_1618.center.values_.elems[0] = (dVar22 + dVar17) * 0.5;
    local_1618.center.values_.elems[1] = (dVar21 + 10.0 + dVar21) * 0.5;
    local_1618.radius.values_.elems[0] = (dVar22 - dVar17) * 0.5;
    local_1618.radius.values_.elems[1] = ((dVar21 + 10.0) - dVar21) * 0.5;
    if (iStack_1560._M_current == local_1558) {
      std::
      vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
      ::_M_realloc_insert<perior::rectangle<perior::point<double,2ul>>const&>
                ((vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
                  *)&local_1568,iStack_1560,&local_1618);
    }
    else {
      ((iStack_1560._M_current)->center).values_.elems[0] = local_1618.center.values_.elems[0];
      ((iStack_1560._M_current)->center).values_.elems[1] = local_1618.center.values_.elems[1];
      ((iStack_1560._M_current)->radius).values_.elems[0] = local_1618.radius.values_.elems[0];
      ((iStack_1560._M_current)->radius).values_.elems[1] = local_1618.radius.values_.elems[1];
      iStack_1560._M_current = iStack_1560._M_current + 1;
    }
    local_15b8.first.center.values_.elems[0] = local_1618.center.values_.elems[0];
    local_15b8.first.center.values_.elems[1] = local_1618.center.values_.elems[1];
    local_15b8.first.radius.values_.elems[0] = local_1618.radius.values_.elems[0];
    local_15b8.first.radius.values_.elems[1] = local_1618.radius.values_.elems[1];
    local_15b8.second = uVar10;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1538,&local_15b8);
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d8,"rtree_","");
    cVar15 = '\x01';
    if (9 < uVar10) {
      uVar11 = uVar10;
      cVar16 = '\x04';
      do {
        cVar15 = cVar16;
        if (uVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00105afa;
        }
        if (uVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00105afa;
        }
        if (uVar11 < 10000) goto LAB_00105afa;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar16 = cVar15 + '\x04';
      } while (bVar3);
      cVar15 = cVar15 + '\x01';
    }
LAB_00105afa:
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct((ulong)&local_15f8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15f8,local_15f0,uVar10);
    dVar17 = 7.4109846876187e-323;
    if (local_15d8 != local_15c8) {
      dVar17 = local_15c8[0];
    }
    dVar21 = (double)(CONCAT44(uStack_15ec,local_15f0) + CONCAT44(uStack_15cc,local_15d0));
    if ((ulong)dVar17 < (ulong)dVar21) {
      dVar17 = 7.4109846876187e-323;
      if (local_15f8 != local_15e8) {
        dVar17 = local_15e8[0];
      }
      if ((ulong)dVar17 < (ulong)dVar21) goto LAB_00105b6d;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_15f8,0,(char *)0x0,(ulong)local_15d8);
    }
    else {
LAB_00105b6d:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_15d8,(ulong)local_15f8);
    }
    pdVar1 = (double *)(puVar6 + 2);
    if ((double *)*puVar6 == pdVar1) {
      local_1628 = *pdVar1;
      uStack_1620 = *(undefined4 *)(puVar6 + 3);
      uStack_161c = *(undefined4 *)((long)puVar6 + 0x1c);
      local_1638 = &local_1628;
    }
    else {
      local_1628 = *pdVar1;
      local_1638 = (double *)*puVar6;
    }
    pdStack_1630 = (double *)puVar6[1];
    *puVar6 = pdVar1;
    puVar6[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_1588 = local_1578;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1588,".svg","");
    dVar17 = 7.4109846876187e-323;
    if (local_1638 != &local_1628) {
      dVar17 = local_1628;
    }
    if ((ulong)dVar17 < (ulong)(local_1580 + (long)pdStack_1630)) {
      dVar17 = 7.4109846876187e-323;
      if (local_1588 != local_1578) {
        dVar17 = local_1578[0];
      }
      if ((ulong)dVar17 < (ulong)(local_1580 + (long)pdStack_1630)) goto LAB_00105c46;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1588,0,(char *)0x0,(ulong)local_1638);
    }
    else {
LAB_00105c46:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1638,(ulong)local_1588);
    }
    pdVar1 = (double *)(puVar6 + 2);
    if ((point_type *)*puVar6 == (point_type *)pdVar1) {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.radius.values_.elems[1] = (double)puVar6[3];
      local_15b8.first.center.values_.elems[0] = (double)ppVar2;
    }
    else {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.center.values_.elems[0] = (double)*puVar6;
    }
    pbVar13 = (boundary_t *)(puVar6 + 1);
    local_15b8.first.center.values_.elems[1] = (double)puVar6[1];
    *puVar6 = pdVar1;
    (pbVar13->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar1 = 0;
    if (local_1588 != local_1578) {
      operator_delete(local_1588);
      pbVar13 = extraout_RDX;
    }
    if (local_1638 != &local_1628) {
      operator_delete(local_1638);
      pbVar13 = extraout_RDX_00;
    }
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar13 = extraout_RDX_01;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar13 = extraout_RDX_02;
    }
    dump((string *)&local_15b8,
         (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          *)local_1538,pbVar13);
    if ((point_type *)local_15b8.first.center.values_.elems[0] != ppVar2) {
      operator_delete((void *)local_15b8.first.center.values_.elems[0]);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x32);
  uVar14 = 0x32;
  do {
    uVar10 = uVar14 - 0x32;
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) | 1;
    if ((ulong)((long)iStack_1560._M_current - (long)local_1568 >> 5) <= uVar10) {
      uVar8 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_1638 != (double *)0x0) {
        operator_delete(local_1638);
      }
      if (local_1568 != (void *)0x0) {
        operator_delete(local_1568);
      }
      perior::
      rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ::~rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)local_1538);
      _Unwind_Resume(uVar8);
    }
    pdVar1 = (double *)((long)local_1568 + uVar10 * 0x20);
    local_15b8.first.center.values_.elems[0] = *pdVar1;
    local_15b8.first.center.values_.elems[1] = pdVar1[1];
    pdVar1 = (double *)((long)local_1568 + uVar10 * 0x20 + 0x10);
    local_15b8.first.radius.values_.elems[0] = *pdVar1;
    local_15b8.first.radius.values_.elems[1] = pdVar1[1];
    local_15b8.second = uVar10;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::remove((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1538,(char *)&local_15b8);
    poVar7 = std::ostream::_M_insert<bool>(false);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_1638 = &local_1628;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1638,"rtree_","");
    uVar12 = uVar14;
    cVar15 = '\x04';
    do {
      cVar16 = cVar15;
      if (uVar12 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_00105e3b;
      }
      if (uVar12 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_00105e3b;
      }
      if (uVar12 < 10000) goto LAB_00105e3b;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar15 = cVar16 + '\x04';
    } while (bVar3);
    cVar16 = cVar16 + '\x01';
LAB_00105e3b:
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct((ulong)&local_15d8,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15d8,local_15d0,uVar14);
    dVar17 = 7.4109846876187e-323;
    if (local_1638 != &local_1628) {
      dVar17 = local_1628;
    }
    dVar21 = (double)(CONCAT44(uStack_15cc,local_15d0) + (long)pdStack_1630);
    if ((ulong)dVar17 < (ulong)dVar21) {
      dVar17 = 7.4109846876187e-323;
      if (local_15d8 != local_15c8) {
        dVar17 = local_15c8[0];
      }
      if ((ulong)dVar17 < (ulong)dVar21) goto LAB_00105ea8;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_15d8,0,(char *)0x0,(ulong)local_1638);
    }
    else {
LAB_00105ea8:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1638,(ulong)local_15d8);
    }
    local_1618.center.values_.elems[0] = (double)&local_1618.radius;
    pdVar1 = (double *)(puVar6 + 2);
    if ((point_type *)*puVar6 == (point_type *)pdVar1) {
      local_1618.radius.values_.elems[0] = *pdVar1;
      local_1618.radius.values_.elems[1] = (double)puVar6[3];
    }
    else {
      local_1618.radius.values_.elems[0] = *pdVar1;
      local_1618.center.values_.elems[0] = (double)*puVar6;
    }
    local_1618.center.values_.elems[1] = (double)puVar6[1];
    *puVar6 = pdVar1;
    puVar6[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15f8,".svg","");
    dVar17 = 7.4109846876187e-323;
    if ((point_type *)local_1618.center.values_.elems[0] != &local_1618.radius) {
      dVar17 = local_1618.radius.values_.elems[0];
    }
    dVar21 = (double)(CONCAT44(uStack_15ec,local_15f0) + (long)local_1618.center.values_.elems[1]);
    if ((ulong)dVar17 < (ulong)dVar21) {
      dVar17 = 7.4109846876187e-323;
      if (local_15f8 != local_15e8) {
        dVar17 = local_15e8[0];
      }
      if ((ulong)dVar17 < (ulong)dVar21) goto LAB_00105f76;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_15f8,0,(char *)0x0,(ulong)local_1618.center.values_.elems[0]
                         );
    }
    else {
LAB_00105f76:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1618,(ulong)local_15f8);
    }
    pdVar1 = (double *)(puVar6 + 2);
    if ((point_type *)*puVar6 == (point_type *)pdVar1) {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.radius.values_.elems[1] = (double)puVar6[3];
      local_15b8.first.center.values_.elems[0] = (double)ppVar2;
    }
    else {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.center.values_.elems[0] = (double)*puVar6;
    }
    pbVar13 = (boundary_t *)(puVar6 + 1);
    local_15b8.first.center.values_.elems[1] = (double)puVar6[1];
    *puVar6 = pdVar1;
    (pbVar13->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar1 = 0;
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar13 = extraout_RDX_03;
    }
    if ((point_type *)local_1618.center.values_.elems[0] != &local_1618.radius) {
      operator_delete((void *)local_1618.center.values_.elems[0]);
      pbVar13 = extraout_RDX_04;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar13 = extraout_RDX_05;
    }
    if (local_1638 != &local_1628) {
      operator_delete(local_1638);
      pbVar13 = extraout_RDX_06;
    }
    dump((string *)&local_15b8,(rtree_t *)local_1538,pbVar13);
    if ((point_type *)local_15b8.first.center.values_.elems[0] != ppVar2) {
      operator_delete((void *)local_15b8.first.center.values_.elems[0]);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x46);
  uVar14 = 0x46;
  do {
    local_1618.radius.values_.elems[0] = 0.0;
    local_1618.radius.values_.elems[1] = 0.0;
    local_1618.center.values_.elems[0] = 0.0;
    local_1618.center.values_.elems[1] = 0.0;
    rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_1548,&local_13b8,&local_1548._M_param);
    iVar9 = (int)rVar5 + (int)(rVar5 / 100) * -100;
    dVar17 = (double)(iVar9 * 10);
    dVar21 = (double)((rVar5 / 100) * 10);
    dVar22 = (double)(iVar9 * 10 + 10);
    local_1618.center.values_.elems[0] = (dVar22 + dVar17) * 0.5;
    local_1618.center.values_.elems[1] = (dVar21 + 10.0 + dVar21) * 0.5;
    local_1618.radius.values_.elems[0] = (dVar22 - dVar17) * 0.5;
    local_1618.radius.values_.elems[1] = ((dVar21 + 10.0) - dVar21) * 0.5;
    if (iStack_1560._M_current == local_1558) {
      std::
      vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
      ::_M_realloc_insert<perior::rectangle<perior::point<double,2ul>>const&>
                ((vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
                  *)&local_1568,iStack_1560,&local_1618);
    }
    else {
      ((iStack_1560._M_current)->center).values_.elems[0] = local_1618.center.values_.elems[0];
      ((iStack_1560._M_current)->center).values_.elems[1] = local_1618.center.values_.elems[1];
      ((iStack_1560._M_current)->radius).values_.elems[0] = local_1618.radius.values_.elems[0];
      ((iStack_1560._M_current)->radius).values_.elems[1] = local_1618.radius.values_.elems[1];
      iStack_1560._M_current = iStack_1560._M_current + 1;
    }
    local_15b8.first.center.values_.elems[0] = local_1618.center.values_.elems[0];
    local_15b8.first.center.values_.elems[1] = local_1618.center.values_.elems[1];
    local_15b8.first.radius.values_.elems[0] = local_1618.radius.values_.elems[0];
    local_15b8.first.radius.values_.elems[1] = local_1618.radius.values_.elems[1];
    local_15b8.second = uVar14;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1538,&local_15b8);
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d8,"rtree_","");
    uVar12 = uVar14;
    cVar15 = '\x04';
    do {
      cVar16 = cVar15;
      if (uVar12 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_001061ee;
      }
      if (uVar12 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_001061ee;
      }
      if (uVar12 < 10000) goto LAB_001061ee;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar15 = cVar16 + '\x04';
    } while (bVar3);
    cVar16 = cVar16 + '\x01';
LAB_001061ee:
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct((ulong)&local_15f8,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15f8,local_15f0,uVar14);
    dVar17 = 7.4109846876187e-323;
    if (local_15d8 != local_15c8) {
      dVar17 = local_15c8[0];
    }
    dVar21 = (double)(CONCAT44(uStack_15ec,local_15f0) + CONCAT44(uStack_15cc,local_15d0));
    if ((ulong)dVar17 < (ulong)dVar21) {
      dVar17 = 7.4109846876187e-323;
      if (local_15f8 != local_15e8) {
        dVar17 = local_15e8[0];
      }
      if ((ulong)dVar17 < (ulong)dVar21) goto LAB_00106261;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_15f8,0,(char *)0x0,(ulong)local_15d8);
    }
    else {
LAB_00106261:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_15d8,(ulong)local_15f8);
    }
    pdVar1 = (double *)(puVar6 + 2);
    if ((double *)*puVar6 == pdVar1) {
      local_1628 = *pdVar1;
      uStack_1620 = *(undefined4 *)(puVar6 + 3);
      uStack_161c = *(undefined4 *)((long)puVar6 + 0x1c);
      local_1638 = &local_1628;
    }
    else {
      local_1628 = *pdVar1;
      local_1638 = (double *)*puVar6;
    }
    pdStack_1630 = (double *)puVar6[1];
    *puVar6 = pdVar1;
    puVar6[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_1588 = local_1578;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1588,".svg","");
    dVar17 = 7.4109846876187e-323;
    if (local_1638 != &local_1628) {
      dVar17 = local_1628;
    }
    if ((ulong)dVar17 < (ulong)(local_1580 + (long)pdStack_1630)) {
      dVar17 = 7.4109846876187e-323;
      if (local_1588 != local_1578) {
        dVar17 = local_1578[0];
      }
      if ((ulong)dVar17 < (ulong)(local_1580 + (long)pdStack_1630)) goto LAB_0010633a;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1588,0,(char *)0x0,(ulong)local_1638);
    }
    else {
LAB_0010633a:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1638,(ulong)local_1588);
    }
    pdVar1 = (double *)(puVar6 + 2);
    if ((point_type *)*puVar6 == (point_type *)pdVar1) {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.radius.values_.elems[1] = (double)puVar6[3];
      local_15b8.first.center.values_.elems[0] = (double)ppVar2;
    }
    else {
      local_15b8.first.radius.values_.elems[0] = *pdVar1;
      local_15b8.first.center.values_.elems[0] = (double)*puVar6;
    }
    pbVar13 = (boundary_t *)(puVar6 + 1);
    local_15b8.first.center.values_.elems[1] = (double)puVar6[1];
    *puVar6 = pdVar1;
    (pbVar13->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar1 = 0;
    if (local_1588 != local_1578) {
      operator_delete(local_1588);
      pbVar13 = extraout_RDX_07;
    }
    if (local_1638 != &local_1628) {
      operator_delete(local_1638);
      pbVar13 = extraout_RDX_08;
    }
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar13 = extraout_RDX_09;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar13 = extraout_RDX_10;
    }
    dump((string *)&local_15b8,
         (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          *)local_1538,pbVar13);
    if ((point_type *)local_15b8.first.center.values_.elems[0] != ppVar2) {
      operator_delete((void *)local_15b8.first.center.values_.elems[0]);
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == 0x5a) {
      local_1618.center.values_.elems[0] = iStack_1560._M_current[-1].center.values_.elems[0];
      local_1618.center.values_.elems[1] = iStack_1560._M_current[-1].center.values_.elems[1];
      local_1618.radius.values_.elems[0] = iStack_1560._M_current[-1].radius.values_.elems[0];
      local_1618.radius.values_.elems[1] = iStack_1560._M_current[-1].radius.values_.elems[1];
      local_1638 = (double *)0x0;
      pdStack_1630 = (double *)0x0;
      local_1628 = 0.0;
      if ((double)local_1538._0_8_ != -NAN) {
        local_15b8.first.center.values_.elems[0] = local_1618.center.values_.elems[0];
        local_15b8.first.center.values_.elems[1] = local_1618.center.values_.elems[1];
        local_15b8.first.radius.values_.elems[0] = local_1618.radius.values_.elems[0];
        local_15b8.first.radius.values_.elems[1] = local_1618.radius.values_.elems[1];
        perior::
        rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
        ::
        query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
                  ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                    *)local_1538,local_1538._0_8_,
                   (query_intersects_box<perior::point<double,_2UL>_> *)&local_15b8,
                   (vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                    *)&local_1638);
        pdVar20 = pdStack_1630;
        pdVar1 = local_1638;
        if (local_1638 != pdStack_1630) {
          lVar18 = (long)pdStack_1630 - (long)local_1638;
          uVar10 = (lVar18 >> 3) * -0x3333333333333333;
          lVar4 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (local_1638,pdStack_1630,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                      (pdVar1,pdVar20);
          }
          else {
            pdVar19 = pdVar1 + 0x50;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                      (pdVar1,pdVar19);
            for (; pdVar19 != pdVar20; pdVar19 = pdVar19 + 5) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                        (pdVar19);
            }
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"queried values = { ",0x13);
      pdVar1 = pdStack_1630;
      if (local_1638 != pdStack_1630) {
        pdVar20 = local_1638;
        do {
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          local_15b8.first.center.values_.elems[0] =
               (double)CONCAT71(local_15b8.first.center.values_.elems[0]._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_15b8,1);
          pdVar20 = pdVar20 + 5;
        } while (pdVar20 != pdVar1);
      }
      local_15b8.first.center.values_.elems[0] =
           (double)CONCAT71(local_15b8.first.center.values_.elems[0]._1_7_,0x7d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_15b8,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_1638 != (double *)0x0) {
        operator_delete(local_1638);
      }
      if (local_1568 != (void *)0x0) {
        operator_delete(local_1568);
      }
      perior::
      rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ::~rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)local_1538);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    boundary_t bdry(point_t{0,0}, point_t{1000, 1000});
    rtree_t tree(bdry);

    std::mt19937 mt_(123456789);
    std::uniform_int_distribution<std::size_t> uni(0, 10000);

    std::vector<aabb_t> boxes;
    for(std::size_t i=0; i<50; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));

        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);

    }

    for(std::size_t i=50; i<70; ++i)
    {
        const std::size_t idx = i - 50;
        std::cout << std::boolalpha << tree.remove(value_t(boxes.at(idx), idx)) << std::endl;
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    for(std::size_t i=70; i<90; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    aabb_t q(boxes.back());
    std::vector<value_t> vals;
    tree.query(perior::query::intersects_box(q), std::back_inserter(vals));

    std::sort(vals.begin(), vals.end(), [](const value_t& lhs, const value_t rhs){return lhs.second < rhs.second;});

    std::cout << "queried values = { ";
    for(auto const& i : vals)
        std::cout << i.second << ' ';
    std::cout << '}' << std::endl;

    return 0;
}